

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser.c++
# Opt level: O1

Maybe<capnp::schema::Node::SourceInfo::Reader> * __thiscall
capnp::SchemaParser::getSourceInfo
          (Maybe<capnp::schema::Node::SourceInfo::Reader> *__return_storage_ptr__,SchemaParser *this
          ,Schema schema)

{
  Impl *pIVar1;
  uint64_t id;
  Schema local_50;
  Reader local_48;
  
  pIVar1 = (this->impl).ptr;
  local_50.raw = schema.raw;
  Schema::getProto(&local_48,&local_50);
  if (local_48._reader.dataSize < 0x40) {
    id = 0;
  }
  else {
    id = *local_48._reader.data;
  }
  capnp::compiler::Compiler::getSourceInfo(__return_storage_ptr__,&pIVar1->compiler,id);
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<schema::Node::SourceInfo::Reader> SchemaParser::getSourceInfo(Schema schema) const {
  return impl->compiler.getSourceInfo(schema.getProto().getId());
}